

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O3

bool __thiscall QFileDevice::atEnd(QFileDevice *this)

{
  QIODevicePrivate *pQVar1;
  QRingBuffer *pQVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  AccessMode AVar6;
  long lVar7;
  
  pQVar1 = (this->super_QIODevice).d_ptr._M_t.
           super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
           super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
           super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl;
  pQVar2 = (pQVar1->buffer).m_buf;
  if ((pQVar2 != (QRingBuffer *)0x0) && (pQVar2->bufferSize != 0)) {
    if (pQVar1->transactionStarted != true) {
      return false;
    }
    AVar6 = pQVar1->accessMode;
    if (AVar6 == Unset) {
      iVar5 = (*pQVar1->q_ptr->_vptr_QIODevice[2])();
      AVar6 = RandomAccess - (char)iVar5;
      pQVar1->accessMode = AVar6;
    }
    if (AVar6 != Sequential) {
      return false;
    }
    pQVar2 = (pQVar1->buffer).m_buf;
    if (pQVar2 == (QRingBuffer *)0x0) {
      lVar7 = 0;
    }
    else {
      lVar7 = pQVar2->bufferSize;
    }
    if (pQVar1->transactionPos != lVar7) {
      return false;
    }
  }
  bVar3 = QIODevice::isOpen(&this->super_QIODevice);
  if (!bVar3) {
    return true;
  }
  if ((char)pQVar1[1].transactionPos == '\x01') {
    *(undefined1 *)&pQVar1[1].transactionPos = 0;
    bVar3 = flush((QFileDevice *)pQVar1->q_ptr);
    if (!bVar3) {
      return false;
    }
  }
  cVar4 = (**(code **)(*pQVar1[1]._vptr_QIODevicePrivate + 0x138))
                    (pQVar1[1]._vptr_QIODevicePrivate,0);
  if (cVar4 == '\0') {
    iVar5 = (*(this->super_QIODevice)._vptr_QIODevice[5])(this);
    if (CONCAT44(extraout_var,iVar5) < pQVar1[1].pos) {
      return false;
    }
    iVar5 = (*(this->super_QIODevice)._vptr_QIODevice[10])(this);
    return CONCAT44(extraout_var_00,iVar5) == 0;
  }
  bVar3 = QAbstractFileEngine::atEnd((QAbstractFileEngine *)pQVar1[1]._vptr_QIODevicePrivate);
  return bVar3;
}

Assistant:

bool QFileDevice::atEnd() const
{
    Q_D(const QFileDevice);

    // If there's buffered data left, we're not at the end.
    if (!d->isBufferEmpty())
        return false;

    if (!isOpen())
        return true;

    if (!d->ensureFlushed())
        return false;

    // If the file engine knows best, say what it says.
    if (d->fileEngine->supportsExtension(QAbstractFileEngine::AtEndExtension)) {
        // Check if the file engine supports AtEndExtension, and if it does,
        // check if the file engine claims to be at the end.
        return d->fileEngine->atEnd();
    }

    // if it looks like we are at the end, or if size is not cached,
    // fall through to bytesAvailable() to make sure.
    if (pos() < d->cachedSize)
        return false;

    // Fall back to checking how much is available (will stat files).
    return bytesAvailable() == 0;
}